

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test::Body
          (iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test *this)

{
  Fixed *pFVar1;
  void *p;
  AssertionResult iutest_ar;
  AssertionResult local_1f0;
  iuCodeMessage local_1c8;
  Fixed local_198;
  
  iutest::internal::NullHelper<false>::CompareNe<void>(&local_1f0,"(T<0, 0>::call(p))",this);
  if (local_1f0.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_198,this);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x18e,local_1f0.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,pFVar1);
  }
  else {
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::internal::NullHelper<false>::CompareNe<void>(&local_1f0,"(T<0, 0>::call(p))",this);
    if (local_1f0.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_198,this);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,400,local_1f0.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::internal::NullHelper<false>::CompareNe<void>(&local_1f0,"(T<0, 0>::call(p))",this);
    if (local_1f0.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_198,this);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x192,local_1f0.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::internal::NullHelper<false>::CompareNe<void>(&local_1f0,"(T<0, 0>::call(p))",this);
    if (local_1f0.m_result != false) goto LAB_002e2db4;
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_198,this);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x194,local_1f0.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,pFVar1);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
LAB_002e2db4:
  std::__cxx11::string::~string((string *)&local_1f0);
  return;
}

Assistant:

IUTEST(SyntaxTest, VariadicNotNull)
{
    if( void* p = this )
        IUTEST_ASSERT_NOTNULL(T<0, 0>::call(p)) << p;
    if( void* p = this )
        IUTEST_EXPECT_NOTNULL(T<0, 0>::call(p)) << p;
    if( void* p = this )
        IUTEST_INFORM_NOTNULL(T<0, 0>::call(p)) << p;
    if( void* p = this )
        IUTEST_ASSUME_NOTNULL(T<0, 0>::call(p)) << p;
}